

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

optional<unsigned_long_long> __thiscall QMetaEnum::keysToValue64(QMetaEnum *this,char *keys)

{
  uint uVar1;
  uint uVar2;
  QMetaObject *pQVar3;
  uint *puVar4;
  uint *puVar5;
  QMetaTypeInterface *pQVar6;
  QByteArrayView view;
  QByteArrayView scope;
  long lVar7;
  char *__n;
  undefined1 *__s1;
  bool bVar8;
  int iVar9;
  size_t __n_00;
  void *pvVar10;
  _Storage<unsigned_long_long,_true> _Var11;
  int iVar12;
  uint uVar13;
  _Storage<QByteArrayView,_true> *p_Var14;
  _Storage<unsigned_long_long,_true> _Var15;
  long lVar16;
  uint uVar17;
  undefined1 *puVar18;
  qsizetype qVar19;
  undefined1 *puVar20;
  ulong uVar21;
  _Storage<unsigned_long_long,_true> unaff_R15;
  char *b;
  long in_FS_OFFSET;
  QByteArrayView QVar22;
  optional<unsigned_long_long> oVar23;
  R_conflict6 parsed;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  QByteArrayView local_128;
  _Storage<QByteArrayView,_true> local_118;
  undefined4 uStack_108;
  undefined4 uStack_104;
  char *pcStack_100;
  undefined1 *local_f8;
  QVLABase<QByteArrayView> local_f0;
  undefined1 local_d8 [160];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = this->mobj;
  if (keys == (char *)0x0 || pQVar3 == (QMetaObject *)0x0) {
    uVar21 = 0;
    goto LAB_0028374f;
  }
  puVar4 = (this->data).d;
  uVar13 = puVar4[2];
  p_Var14 = (_Storage<QByteArrayView,_true> *)0x40;
  if (((uVar13 & 0x40) == 0) && (p_Var14 = (_Storage<QByteArrayView,_true> *)0x0, (uVar13 & 1) == 0)
     ) {
    puVar5 = (pQVar3->d).data;
    pQVar6 = (pQVar3->d).metaTypes
             [(long)(int)puVar5[6] +
              (ulong)((int)((ulong)((long)puVar4 - (long)puVar5) >> 2) - puVar5[9]) / 5];
    if (pQVar6 == (QMetaTypeInterface *)0x0) {
      p_Var14 = (_Storage<QByteArrayView,_true> *)0xffffffff;
    }
    else {
      p_Var14 = (_Storage<QByteArrayView,_true> *)(ulong)(((pQVar6->flags >> 8 & 1) != 0) - 1);
    }
  }
  memset(local_d8,0xaa,0xa0);
  local_f0.super_QVLABaseBase.a = 10;
  local_f0.super_QVLABaseBase.s = 0;
  lVar16 = -1;
  do {
    lVar7 = lVar16 + 1;
    lVar16 = lVar16 + 1;
  } while (keys[lVar7] != '\0');
  QVar22.m_data._0_4_ = in_stack_fffffffffffffea8;
  QVar22.m_size = 0x2834bf;
  QVar22.m_data._4_4_ = in_stack_fffffffffffffeac;
  local_f0.super_QVLABaseBase.ptr = local_d8;
  local_128 = QtPrivate::trimmed(QVar22);
  _Var11._M_value = (unsigned_long_long)local_128.m_data;
  __n_00 = local_128.m_size;
  if (__n_00 == 0) {
    local_118._M_value.m_size._0_4_ = 2;
    local_118._M_value.m_size._4_4_ = 0;
    local_118._8_4_ = 0;
    local_118._12_4_ = 0;
    uStack_108 = 0;
    uStack_104 = 0;
    pcStack_100 = "default";
    QMessageLogger::warning
              ((QMessageLogger *)&local_118._M_value,"QMetaEnum::keysToValue: empty keys string.");
LAB_00283722:
    uVar21 = 0;
    unaff_R15 = (_Storage<unsigned_long_long,_true>)keys;
  }
  else {
    if (((0 < (long)__n_00) &&
        (pvVar10 = memchr((void *)_Var11,0x7c,__n_00), pvVar10 != (void *)0x0)) &&
       (qVar19 = (long)pvVar10 - (long)_Var11, qVar19 != -1)) {
      keys = (char *)_Var11._M_value;
      if (qVar19 == 0) {
        local_118._M_value.m_size._0_4_ = 2;
        local_118._M_value.m_size._4_4_ = 0;
        local_118._8_4_ = 0;
        local_118._12_4_ = 0;
        uStack_108 = 0;
        uStack_104 = 0;
        pcStack_100 = "default";
        QMessageLogger::warning
                  ((QMessageLogger *)&local_118._M_value,
                   "QMetaEnum::keysToValue: malformed keys string, starts with \'|\', \"%s\"",
                   _Var11._M_value);
      }
      else {
        if (((char *)(_Var11._M_value - 1))[__n_00] != '|') {
          uVar13 = (uint)p_Var14;
          _Var15._M_value = _Var11._M_value;
          do {
            local_118._M_value.m_size = (long)(_Var11._M_value + qVar19) - (long)_Var15;
            local_118._8_4_ = (undefined4)_Var15._M_value;
            local_118._12_4_ = (undefined4)((ulong)_Var15 >> 0x20);
            QVLABase<QByteArrayView>::emplace_back_impl<QByteArrayView>
                      (&local_f0,10,local_d8,&local_118._M_value);
            if (((char *)(_Var11._M_value + 1))[qVar19] == '|') {
              local_118._M_value.m_size._0_4_ = 2;
              local_118._M_value.m_size._4_4_ = 0;
              local_118._8_4_ = 0;
              local_118._12_4_ = 0;
              uStack_108 = 0;
              uStack_104 = 0;
              pcStack_100 = "default";
              QMessageLogger::warning
                        ((QMessageLogger *)&local_118._M_value,
                         "QMetaEnum::keysToValue: malformed keys string, has two consecutive \'|\': \"%s\""
                         ,local_128.m_data);
              goto LAB_00283722;
            }
            _Var15._M_value = (long)(_Var11._M_value + qVar19) + 1;
            lVar16 = qVar19 + 1;
            qVar19 = QByteArrayView::indexOf(&local_128,'|',lVar16);
            local_118._M_value.m_size = __n_00 - lVar16;
          } while ((local_118._M_value.m_size != 0) && (qVar19 != -1));
          local_118._M_value.m_data = (storage_type *)_Var15._M_value;
          QVLABase<QByteArrayView>::emplace_back_impl<QByteArrayView>
                    (&local_f0,10,local_d8,&local_118._M_value);
          p_Var14 = (_Storage<QByteArrayView,_true> *)(ulong)uVar13;
          goto LAB_00283555;
        }
        local_118._M_value.m_size._0_4_ = 2;
        local_118._M_value.m_size._4_4_ = 0;
        local_118._8_4_ = 0;
        local_118._12_4_ = 0;
        uStack_108 = 0;
        uStack_104 = 0;
        pcStack_100 = "default";
        QMessageLogger::warning
                  ((QMessageLogger *)&local_118._M_value,
                   "QMetaEnum::keysToValue: malformed keys string, ends with \'|\', \"%s\"",
                   _Var11._M_value);
      }
      goto LAB_00283722;
    }
    QVLABase<QByteArrayView>::emplace_back_impl<QByteArrayView_const&>
              (&local_f0,10,local_d8,&local_128);
LAB_00283555:
    if (local_f0.super_QVLABaseBase.s == 0) {
      unaff_R15._M_value = 0;
    }
    else {
      iVar12 = (int)p_Var14;
      puVar18 = (undefined1 *)
                ((long)local_f0.super_QVLABaseBase.ptr + local_f0.super_QVLABaseBase.s * 0x10);
      unaff_R15._M_value = 0;
      puVar20 = (undefined1 *)local_f0.super_QVLABaseBase.ptr;
      do {
        local_f8 = &DAT_aaaaaaaaaaaaaaaa;
        uStack_108 = 0xaaaaaaaa;
        uStack_104 = 0xaaaaaaaa;
        pcStack_100 = &DAT_aaaaaaaaaaaaaaaa;
        local_118._M_value.m_size._0_4_ = 0xaaaaaaaa;
        local_118._M_value.m_size._4_4_ = 0xaaaaaaaa;
        local_118._8_4_ = 0xaaaaaaaa;
        local_118._12_4_ = 0xaaaaaaaa;
        view.m_data._0_4_ = in_stack_fffffffffffffea8;
        view.m_size = 0x2835b2;
        view.m_data._4_4_ = iVar12;
        QVar22 = QtPrivate::trimmed(view);
        parse_scope((R_conflict6 *)&local_118._M_value,QVar22);
        puVar4 = (this->data).d;
        if (((char)uStack_108 == '\x01') &&
           (scope.m_size._4_4_ = local_118._M_value.m_size._4_4_,
           scope.m_size._0_4_ = local_118._M_value.m_size._0_4_,
           scope.m_data._0_4_ = local_118._8_4_, scope.m_data._4_4_ = local_118._12_4_,
           bVar8 = isScopeMatch(scope,(QMetaEnum *)this->mobj), keys = (char *)unaff_R15, !bVar8))
        goto LAB_00283722;
        __s1 = local_f8;
        __n = pcStack_100;
        uVar1 = puVar4[3];
        _Var11 = unaff_R15;
        if ((long)(int)uVar1 < 1) {
LAB_00283726:
          uVar21 = 0;
          unaff_R15 = _Var11;
          goto LAB_00283737;
        }
        _Var11 = (_Storage<unsigned_long_long,_true>)(this->mobj->d).stringdata;
        puVar5 = (this->mobj->d).data;
        uVar2 = puVar4[4];
        uVar21 = (long)(int)uVar1 + 1;
        uVar13 = uVar2 + uVar1 * 3;
        uVar17 = (uVar2 + uVar1 * 2) - 1;
        while( true ) {
          uVar13 = uVar13 - 1;
          if ((__n == (char *)(ulong)*(uint *)(_Var11._M_value +
                                              (long)(int)(puVar5[uVar17 - 1] * 2 + 1) * 4)) &&
             ((__n == (char *)0x0 ||
              (iVar9 = bcmp(__s1,(char *)(*(uint *)(_Var11._M_value +
                                                   (long)(int)puVar5[uVar17 - 1] * 8) +
                                         _Var11._M_value),(size_t)__n), iVar9 == 0)))) break;
          uVar21 = uVar21 - 1;
          uVar17 = uVar17 - 2;
          if (uVar21 < 2) goto LAB_00283726;
        }
        uVar17 = puVar5[uVar17];
        if (iVar12 < 1) {
          uVar21 = (long)(int)uVar17;
          if (iVar12 == 0) {
            uVar21 = (ulong)uVar17;
          }
        }
        else {
          uVar21 = CONCAT44(puVar5[uVar13],uVar17);
        }
        p_Var14 = &local_118;
        unaff_R15._M_value = unaff_R15._M_value | uVar21;
        puVar20 = puVar20 + 0x10;
      } while (puVar20 != puVar18);
    }
    uVar21 = CONCAT71((int7)((ulong)p_Var14 >> 8),1);
  }
LAB_00283737:
  if ((undefined1 *)local_f0.super_QVLABaseBase.ptr != local_d8) {
    QtPrivate::sizedFree(local_f0.super_QVLABaseBase.ptr,local_f0.super_QVLABaseBase.a << 4);
  }
LAB_0028374f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  oVar23.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._8_8_ = uVar21 & 0xffffffff;
  oVar23.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._M_payload._M_value = unaff_R15._M_value;
  return (optional<unsigned_long_long>)
         oVar23.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long_long>;
}

Assistant:

std::optional<quint64> QMetaEnum::keysToValue64(const char *keys) const
{
    if (!mobj || !keys)
        return std::nullopt;

    EnumExtendMode mode = enumExtendMode(*this);
    auto lookup = [&] (QByteArrayView key) -> std::optional<quint64> {
        for (int i = data.keyCount() - 1; i >= 0; --i) {
            if (key == stringDataView(mobj, mobj->d.data[data.data() + 2*i]))
                return value_helper(i, mode);
        }
        return std::nullopt;
    };

    quint64 value = 0;
    QVarLengthArray<QByteArrayView, 10> list;
    const bool r = parseEnumFlags(QByteArrayView{keys}, list);
    if (!r)
        return std::nullopt;
    for (const auto &untrimmed : list) {
        const auto parsed = parse_scope(untrimmed.trimmed());
        if (parsed.scope && !isScopeMatch(*parsed.scope, this))
            return std::nullopt; // wrong type name in qualified name
        if (auto thisValue = lookup(parsed.key))
            value |= *thisValue;
        else
            return std::nullopt; // no such enumerator
    }
    return value;
}